

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderErrorsTestCaseBase::TessellationShaderErrorsTestCaseBase
          (TessellationShaderErrorsTestCaseBase *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  TessellationShaderErrorsTestCaseBase *this_local;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderErrorsTestCaseBase_032611e0;
  this->m_fs_ids = (GLuint *)0x0;
  this->m_n_program_objects = 0;
  this->m_po_ids = (GLuint *)0x0;
  this->m_tc_ids = (GLuint *)0x0;
  this->m_te_ids = (GLuint *)0x0;
  this->m_vs_ids = (GLuint *)0x0;
  return;
}

Assistant:

TessellationShaderErrorsTestCaseBase::TessellationShaderErrorsTestCaseBase(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_fs_ids(DE_NULL)
	, m_n_program_objects(0)
	, m_po_ids(DE_NULL)
	, m_tc_ids(DE_NULL)
	, m_te_ids(DE_NULL)
	, m_vs_ids(DE_NULL)
{
	/* Left blank intentionally */
}